

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.cpp
# Opt level: O0

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  uint uVar3;
  GCObject **local_50;
  int h1;
  uint h;
  GCObject *next;
  GCObject *p;
  int i;
  stringtable *tb;
  GCObject **newhash;
  int newsize_local;
  lua_State *L_local;
  
  if (L->l_G->gcstate != '\x02') {
    if ((ulong)(long)(newsize + 1) < 0x2000000000000000) {
      local_50 = (GCObject **)luaM_realloc_(L,(void *)0x0,0,(long)newsize << 3);
    }
    else {
      local_50 = (GCObject **)luaM_toobig(L);
    }
    pgVar1 = L->l_G;
    for (p._4_4_ = 0; p._4_4_ < newsize; p._4_4_ = p._4_4_ + 1) {
      local_50[p._4_4_] = (GCObject *)0x0;
    }
    for (p._4_4_ = 0; p._4_4_ < (pgVar1->strt).size; p._4_4_ = p._4_4_ + 1) {
      next = (pgVar1->strt).hash[p._4_4_];
      while (next != (GCObject *)0x0) {
        pGVar2 = (next->gch).next;
        uVar3 = *(uint *)((long)next + 0xc) & newsize - 1U;
        (next->gch).next = local_50[(int)uVar3];
        local_50[(int)uVar3] = next;
        next = pGVar2;
      }
    }
    luaM_realloc_(L,(pgVar1->strt).hash,(long)(pgVar1->strt).size << 3,0);
    (pgVar1->strt).size = newsize;
    (pgVar1->strt).hash = local_50;
  }
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  GCObject **newhash;
  stringtable *tb;
  int i;
  if (G(L)->gcstate == GCSsweepstring)
    return;  /* cannot resize during GC traverse */
  newhash = luaM_newvector(L, newsize, GCObject *);
  tb = &G(L)->strt;
  for (i=0; i<newsize; i++) newhash[i] = NULL;
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    while (p) {  /* for each node in the list */
      GCObject *next = p->gch.next;  /* save next */
      unsigned int h = gco2ts(p)->hash;
      int h1 = lmod(h, newsize);  /* new position */
      lua_assert(cast_int(h%newsize) == lmod(h, newsize));
      p->gch.next = newhash[h1];  /* chain it */
      newhash[h1] = p;
      p = next;
    }
  }
  luaM_freearray(L, tb->hash, tb->size, TString *);
  tb->size = newsize;
  tb->hash = newhash;
}